

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::erase
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          Iterator *it)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  Iterator *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  int key;
  int in_stack_00000084;
  data_node_type *in_stack_00000088;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_stack_00000090;
  
  bVar2 = Iterator::is_end(in_RSI);
  if (!bVar2) {
    piVar3 = Iterator::key((Iterator *)0x180614);
    iVar1 = *piVar3;
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
    erase_one_at(in_RDI,(int)((ulong)in_RSI >> 0x20));
    *(int *)&in_RDI->key_less_ = *(int *)&in_RDI->key_less_ + -1;
    if (in_RSI->cur_leaf_->num_keys_ == 0) {
      merge(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    }
    if (in_RDI->min_key_ < iVar1) {
      in_RDI->num_right_out_of_bounds_inserts_ = in_RDI->num_right_out_of_bounds_inserts_ + -1;
    }
    else if (iVar1 < in_RDI->max_key_) {
      in_RDI->num_left_out_of_bounds_inserts_ = in_RDI->num_left_out_of_bounds_inserts_ + -1;
    }
  }
  return;
}

Assistant:

void erase(Iterator it) {
    if (it.is_end()) {
      return;
    }
    T key = it.key();
    it.cur_leaf_->erase_one_at(it.cur_idx_);
    stats_.num_keys--;
    if (it.cur_leaf_->num_keys_ == 0) {
      merge(it.cur_leaf_, key);
    }
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain--;
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain--;
    }
  }